

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManStop(Gia_Iso2Man_t *p)

{
  Gia_Iso2Man_t *p_local;
  
  Vec_IntFree(p->vUniques);
  Vec_IntFree(p->vTied);
  Vec_IntFree(p->vTable);
  Vec_IntFree(p->vPlaces);
  Vec_PtrFree(p->vSingles);
  Vec_IntFree(p->vMap0);
  Vec_IntFree(p->vMap1);
  Vec_IntFree(p->vVec0);
  Vec_IntFree(p->vVec1);
  if (p != (Gia_Iso2Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_Iso2ManStop( Gia_Iso2Man_t * p )
{
    Vec_IntFree( p->vUniques );
    Vec_IntFree( p->vTied );
    Vec_IntFree( p->vTable );
    Vec_IntFree( p->vPlaces );
    Vec_PtrFree( p->vSingles );
    Vec_IntFree( p->vMap0 );
    Vec_IntFree( p->vMap1 );
    Vec_IntFree( p->vVec0 );
    Vec_IntFree( p->vVec1 );
    ABC_FREE( p );
}